

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitHop.c
# Opt level: O1

int Kit_GraphToGia(Gia_Man_t *pMan,Kit_Graph_t *pGraph,Vec_Int_t *vLeaves,int fHash)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  Kit_Edge_t KVar5;
  int iVar6;
  long lVar7;
  Gia_Obj_t *pGVar8;
  
  if (0 < pGraph->nLeaves) {
    lVar3 = 2;
    lVar4 = 0;
    do {
      if (vLeaves == (Vec_Int_t *)0x0) {
        lVar7 = (long)pMan->vCis->nSize;
        if (lVar7 - pMan->nRegs <= lVar4) {
          __assert_fail("v < Gia_ManPiNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
        }
        if (lVar7 <= lVar4) goto LAB_005d6258;
        iVar2 = pMan->vCis->pArray[lVar4];
        if (((long)iVar2 < 0) || (pMan->nObjs <= iVar2)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar1 = pMan->pObjs;
        pGVar8 = (Gia_Obj_t *)((ulong)(pGVar1 + iVar2) & 0xfffffffffffffffe);
        if ((pGVar8 < pGVar1) || (pGVar1 + pMan->nObjs <= pGVar8)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar6 = (int)((ulong)((long)pGVar8 - (long)pGVar1) >> 2);
        if (iVar6 * -0x55555555 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        KVar5 = (Kit_Edge_t)(((uint)(pGVar1 + iVar2) & 1) + iVar6 * 0x55555556);
      }
      else {
        if (vLeaves->nSize <= lVar4) {
LAB_005d6258:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        KVar5 = *(Kit_Edge_t *)(vLeaves->pArray + lVar4);
      }
      (&pGraph->pNodes->eEdge0)[lVar3] = KVar5;
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 6;
    } while (lVar4 < pGraph->nLeaves);
  }
  iVar2 = Kit_GraphToGiaInternal(pMan,pGraph,fHash);
  return iVar2;
}

Assistant:

int Kit_GraphToGia( Gia_Man_t * pMan, Kit_Graph_t * pGraph, Vec_Int_t * vLeaves, int fHash )
{
    Kit_Node_t * pNode = NULL;
    int i;
    // collect the fanins
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->iFunc = vLeaves ? Vec_IntEntry(vLeaves, i) : Gia_Obj2Lit(pMan, Gia_ManPi(pMan, i));
    // perform strashing
    return Kit_GraphToGiaInternal( pMan, pGraph, fHash );
}